

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.cpp
# Opt level: O2

void calculate_factors(int *factors,int num_dims,int *stencil,int stencil_size)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)stencil_size;
  if (stencil_size < 1) {
    uVar1 = uVar2;
  }
  uVar3 = 0;
  if (0 < num_dims) {
    uVar3 = (ulong)(uint)num_dims;
  }
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    factors[uVar2] = 0;
    iVar4 = 0;
    piVar5 = stencil;
    uVar6 = uVar1;
    while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
      if (*piVar5 != 0) {
        iVar4 = iVar4 + 1;
        factors[uVar2] = iVar4;
      }
      piVar5 = piVar5 + num_dims;
    }
    stencil = stencil + 1;
  }
  return;
}

Assistant:

void calculate_factors(int *factors, int num_dims, const int *stencil, int stencil_size) {
    for (int d = 0; d < num_dims; d++) {
        factors[d] = 0;
        for (int i = 0; i < stencil_size; ++i) {

            if (stencil[(i * num_dims) + d] != 0) {
                factors[d]++;
            }
        }
    }
}